

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
indk::NeuralNet::doSignalTransfer
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,NeuralNet *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *Xx,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *inputs)

{
  pointer *this_00;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l_00;
  bool bVar1;
  int iVar2;
  reference ename;
  reference pvVar3;
  reference __x;
  size_type sVar4;
  size_type sVar5;
  Computer *pCVar6;
  vector<float,_std::allocator<float>_> *local_360;
  vector<float,_std::allocator<float>_> *local_2e8;
  allocator local_299;
  string local_298;
  reference local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end2_5;
  iterator __begin2_5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_5;
  pointer pvStack_250;
  pointer local_248;
  allocator<std::vector<float,_std::allocator<float>_>_> local_239;
  vector<float,_std::allocator<float>_> *local_238;
  vector<float,_std::allocator<float>_> local_230;
  undefined1 local_218 [40];
  reference local_1f0;
  vector<float,_std::allocator<float>_> *X_1;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__range2_4;
  reference local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
  *n_1;
  iterator __end2_3;
  iterator __begin2_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *__range2_3;
  reference local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
  *n;
  iterator __end2_2;
  iterator __begin2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *__range2_2;
  vector<float,_std::allocator<float>_> *local_178;
  vector<float,_std::allocator<float>_> local_170;
  undefined1 local_158 [40];
  reference local_130;
  vector<float,_std::allocator<float>_> *X;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nname;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  int64_t ne;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string eseq;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  EntryList eentries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nsync;
  vector<void_*,_std::allocator<void_*>_> v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputs_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *Xx_local;
  NeuralNet *this_local;
  
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &nsync.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&eentries.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)local_70);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(inputs);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"all",&local_91);
    doParseLinks(this,&this->Entries,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_70,&this->Entries);
  }
  else {
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(inputs);
    e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(inputs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&e), bVar1) {
      ename = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
      sVar4 = doFindEntry(this,ename);
      if (sVar4 != 0xffffffffffffffff) {
        pvVar3 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&this->Entries,sVar4);
        std::
        vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
        ::
        emplace_back<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                  ((vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    *)local_70,pvVar3);
        std::__cxx11::string::append((string *)&__range2);
        if ((this->StateSyncEnabled & 1U) != 0) {
          pvVar3 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::operator[](&this->Entries,sVar4);
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&pvVar3->second);
          nname = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&pvVar3->second);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&nname), bVar1) {
            __x = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&eentries.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    doParseLinks(this,(EntryList *)local_70,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
  }
  iVar2 = System::getComputeBackendKind();
  if (iVar2 == 0) {
    doReserveSignalBuffer(this,1);
    __end2_1 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::begin(Xx);
    X = (vector<float,_std::allocator<float>_> *)
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::end(Xx);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                               *)&X), bVar1) {
      local_130 = __gnu_cxx::
                  __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator*(&__end2_1);
      local_178 = &local_170;
      std::vector<float,_std::allocator<float>_>::vector(local_178,local_130);
      local_158._0_8_ = &local_170;
      local_158._8_8_ = (pointer)0x1;
      std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
                ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&__range2_2 + 7));
      __l_00._M_len = local_158._8_8_;
      __l_00._M_array = (iterator)local_158._0_8_;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)(local_158 + 0x10),__l_00,
               (allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&__range2_2 + 7));
      doSignalProcessStart
                (this,(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       *)(local_158 + 0x10),(EntryList *)local_70);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)(local_158 + 0x10));
      std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
                ((allocator<std::vector<float,_std::allocator<float>_>_> *)((long)&__range2_2 + 7));
      local_2e8 = (vector<float,_std::allocator<float>_> *)local_158;
      do {
        local_2e8 = local_2e8 + -1;
        std::vector<float,_std::allocator<float>_>::~vector(local_2e8);
      } while (local_2e8 != &local_170);
      Profiler::doEmit(this,1);
      __gnu_cxx::
      __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  else if (iVar2 == 1) {
    sVar4 = getSignalBufferSize(this);
    sVar5 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(Xx);
    if (sVar4 != sVar5) {
      sVar4 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(Xx);
      doReserveSignalBuffer(this,sVar4);
    }
    __end2_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
               ::begin(&this->Neurons);
    n = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
           ::end(&this->Neurons);
    while (bVar1 = std::operator!=(&__end2_2,(_Self *)&n), bVar1) {
      local_1a0 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>
                  ::operator*(&__end2_2);
      __range2_3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                    *)local_1a0->second;
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)
                 &nsync.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&__range2_3);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>
      ::operator++(&__end2_2);
    }
    pCVar6 = System::getComputeBackend();
    (**pCVar6->_vptr_Computer)
              (pCVar6,&nsync.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    doSignalProcessStart(this,Xx,(EntryList *)local_70);
    pCVar6 = System::getComputeBackend();
    (*pCVar6->_vptr_Computer[2])();
    pCVar6 = System::getComputeBackend();
    (*pCVar6->_vptr_Computer[1])();
  }
  else if (iVar2 == 2) {
    sVar4 = getSignalBufferSize(this);
    sVar5 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(Xx);
    if (sVar4 != sVar5) {
      sVar4 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(Xx);
      doReserveSignalBuffer(this,sVar4);
    }
    __end2_3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
               ::begin(&this->Neurons);
    n_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
             ::end(&this->Neurons);
    while (bVar1 = std::operator!=(&__end2_3,(_Self *)&n_1), bVar1) {
      local_1c8 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>
                  ::operator*(&__end2_3);
      __range2_4 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)local_1c8->second;
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)
                 &nsync.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&__range2_4);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>
      ::operator++(&__end2_3);
    }
    pCVar6 = System::getComputeBackend();
    (**pCVar6->_vptr_Computer)
              (pCVar6,&nsync.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2_4 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::begin(Xx);
    X_1 = (vector<float,_std::allocator<float>_> *)
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::end(Xx);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                               *)&X_1), bVar1) {
      local_1f0 = __gnu_cxx::
                  __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator*(&__end2_4);
      local_238 = &local_230;
      std::vector<float,_std::allocator<float>_>::vector(local_238,local_1f0);
      local_218._0_8_ = &local_230;
      local_218._8_8_ = (pointer)0x1;
      std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(&local_239);
      __l._M_len = local_218._8_8_;
      __l._M_array = (iterator)local_218._0_8_;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)(local_218 + 0x10),__l,&local_239);
      doSignalProcessStart
                (this,(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       *)(local_218 + 0x10),(EntryList *)local_70);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)(local_218 + 0x10));
      std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator(&local_239);
      local_360 = (vector<float,_std::allocator<float>_> *)local_218;
      do {
        local_360 = local_360 + -1;
        std::vector<float,_std::allocator<float>_>::~vector(local_360);
      } while (local_360 != &local_230);
      __gnu_cxx::
      __normal_iterator<const_std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator++(&__end2_4);
    }
    __range2_5 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
    pvStack_250 = (pointer)0x0;
    local_248 = (pointer)0x0;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&__range2_5);
    doSignalProcessStart
              (this,(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)&__range2_5,(EntryList *)local_70);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&__range2_5);
    pCVar6 = System::getComputeBackend();
    (*pCVar6->_vptr_Computer[1])();
  }
  iVar2 = System::getComputeBackendKind();
  this->LastUsedComputeBackend = iVar2;
  Profiler::doEmit(this,0);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(inputs);
  if ((!bVar1) && ((this->StateSyncEnabled & 1U) != 0)) {
    this_00 = &eentries.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2_5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00);
    name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&name), bVar1) {
      local_278 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_5);
      doSyncNeuronStates(this,local_278);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_5);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"",&local_299);
  doSignalReceive(__return_storage_ptr__,this,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&eentries.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &nsync.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<indk::OutputValue> indk::NeuralNet::doSignalTransfer(const std::vector<std::vector<float>>& Xx, const std::vector<std::string>& inputs) {
    std::vector<void*> v;
    std::vector<std::string> nsync;
    EntryList eentries;

    if (inputs.empty()) {
        doParseLinks(Entries, "all");
        eentries = Entries;
    } else {
        std::string eseq;
        for (const auto &e: inputs) {
            auto ne = doFindEntry(e);
            if (ne != -1) {
                eentries.emplace_back(Entries[ne]);
                eseq.append(e);
                if (StateSyncEnabled) {
                    for (auto &nname: Entries[ne].second) {
                        nsync.push_back(nname);
                    }
                }
            }
        }
        doParseLinks(eentries, eseq);
    }

    switch (indk::System::getComputeBackendKind()) {
        case indk::System::ComputeBackends::Default:
            doReserveSignalBuffer(1);
            for (auto &X: Xx) {
                doSignalProcessStart({X}, eentries);
                indk::Profiler::doEmit(this, indk::Profiler::EventFlags::EventTick);
            }
            break;

        case indk::System::ComputeBackends::Multithread:
            if (getSignalBufferSize() != Xx.size()) doReserveSignalBuffer(Xx.size());
            for (const auto &n: Neurons) v.push_back((void*)n.second);
            indk::System::getComputeBackend() -> doRegisterHost(v);
            doSignalProcessStart(Xx, eentries);
            indk::System::getComputeBackend() -> doWaitTarget();
            indk::System::getComputeBackend() -> doUnregisterHost();
            break;

        case indk::System::ComputeBackends::OpenCL:
            if (getSignalBufferSize() != Xx.size()) doReserveSignalBuffer(Xx.size());
            for (const auto &n: Neurons) v.push_back((void*)n.second);
            indk::System::getComputeBackend() -> doRegisterHost(v);
            for (auto &X: Xx) {
                doSignalProcessStart({X}, eentries);
            }
            doSignalProcessStart({}, eentries);
            indk::System::getComputeBackend() -> doUnregisterHost();
            break;
    }

    LastUsedComputeBackend = indk::System::getComputeBackendKind();
    indk::Profiler::doEmit(this, indk::Profiler::EventFlags::EventProcessed);

    if (!inputs.empty() && StateSyncEnabled) {
        for (const auto &name: nsync) {
            doSyncNeuronStates(name);
        }
    }

    return doSignalReceive();
}